

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O3

void __thiscall BufferTest_VirtualDtor_Test::TestBody(BufferTest_VirtualDtor_Test *this)

{
  StrictMock<dying_buffer> *this_00;
  
  this_00 = (StrictMock<dying_buffer> *)operator_new(0x78);
  testing::StrictMock<dying_buffer>::StrictMock(this_00);
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)&(this_00->super_dying_buffer).gmock0_die_131,this_00);
  testing::internal::MockSpec<void_()>::InternalExpectedAt
            (&(this_00->super_dying_buffer).gmock0_die_131.super_FunctionMockerBase<void_()>.
              current_spec_,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x8a,"*mock_buffer","die()");
  if (this_00 != (StrictMock<dying_buffer> *)0x0) {
    (*(this_00->super_dying_buffer).super_test_buffer<int>.super_basic_buffer<int>.
      _vptr_basic_buffer[2])(this_00);
    return;
  }
  return;
}

Assistant:

TEST(BufferTest, VirtualDtor) {
  typedef StrictMock<dying_buffer> stict_mock_buffer;
  stict_mock_buffer *mock_buffer = new stict_mock_buffer();
  EXPECT_CALL(*mock_buffer, die());
  basic_buffer<int> *buffer = mock_buffer;
  delete buffer;
}